

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::CheckNinjaCodePage(cmGlobalNinjaGenerator *this)

{
  cmake *pcVar1;
  bool bVar2;
  long lVar3;
  basic_string_view<char,_std::char_traits<char>_> __x;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view str;
  string_view separator;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  int result;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_288;
  string local_278;
  string_view lineView;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string error;
  string output;
  istringstream outputStream;
  string local_188 [32];
  string local_168 [320];
  
  std::__cxx11::string::string((string *)&outputStream,(string *)&this->NinjaCommand);
  std::__cxx11::string::string<std::allocator<char>>(local_188,"-t",(allocator<char> *)&line);
  std::__cxx11::string::string<std::allocator<char>>
            (local_168,"wincodepage",(allocator<char> *)&output);
  __l._M_len = 3;
  __l._M_array = (iterator)&outputStream;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&command,__l,(allocator_type *)&error);
  lVar3 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(&outputStream + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  bVar2 = cmSystemTools::RunSingleCommand
                    (&command,&output,&error,&result,(char *)0x0,OUTPUT_NONE,(cmDuration)0x0,Auto);
  if (bVar2) {
    if (result == 0) {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&outputStream,(string *)&output,_S_in);
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      do {
        bVar2 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&outputStream,&line,(bool *)0x0,0xffffffffffffffff);
        if (!bVar2) {
          pcVar1 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&lineView,
                     "Could not determine Ninja\'s code page, defaulting to UTF-8",
                     (allocator<char> *)&local_288);
          local_278._M_dataplus._M_p = (pointer)0x0;
          local_278._M_string_length = 0;
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                    ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_278);
          cmake::IssueMessage(pcVar1,WARNING,(string *)&lineView,(cmListFileBacktrace *)&local_278);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_278._M_string_length);
          std::__cxx11::string::~string((string *)&lineView);
          this->NinjaExpectedEncoding = None;
          goto LAB_002e302e;
        }
        str._M_str = line._M_dataplus._M_p;
        str._M_len = line._M_string_length;
        bVar2 = cmHasLiteralPrefix<22ul>(str,(char (*) [22])"Build file encoding: ");
      } while (!bVar2);
      lineView._M_len = line._M_string_length;
      lineView._M_str = line._M_dataplus._M_p;
      __x = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&lineView,0x15,0xffffffffffffffff);
      __y._M_str = "UTF-8";
      __y._M_len = 5;
      bVar2 = std::operator==(__x,__y);
      this->NinjaExpectedEncoding = (uint)!bVar2 + (uint)!bVar2 * 2;
LAB_002e302e:
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::istringstream::~istringstream((istringstream *)&outputStream);
    }
    else {
      this->NinjaExpectedEncoding = ANSI;
    }
  }
  else {
    pcVar1 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
    _outputStream = (pointer)0xa;
    separator._M_str = "\' \'";
    separator._M_len = 3;
    cmJoin(&local_278,&command,separator,(string_view)ZEXT816(0));
    line._M_dataplus._M_p = (pointer)local_278._M_string_length;
    line._M_string_length = (size_type)local_278._M_dataplus._M_p;
    cmStrCat<char[17],std::__cxx11::string>
              ((string *)&lineView,(cmAlphaNum *)&outputStream,(cmAlphaNum *)&line,
               (char (*) [17])"\'\nfailed with:\n ",&error);
    local_288.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_288.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_288);
    cmake::IssueMessage(pcVar1,FATAL_ERROR,(string *)&lineView,(cmListFileBacktrace *)&local_288);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_288.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)&lineView);
    std::__cxx11::string::~string((string *)&local_278);
    cmSystemTools::s_FatalErrorOccurred = true;
  }
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::~string((string *)&output);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&command);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::CheckNinjaCodePage()
{
  std::vector<std::string> command{ this->NinjaCommand, "-t", "wincodepage" };
  std::string output;
  std::string error;
  int result;
  if (!cmSystemTools::RunSingleCommand(command, &output, &error, &result,
                                       nullptr, cmSystemTools::OUTPUT_NONE)) {
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                           cmStrCat("Running\n '",
                                                    cmJoin(command, "' '"),
                                                    "'\n"
                                                    "failed with:\n ",
                                                    error));
    cmSystemTools::SetFatalErrorOccurred();
  } else if (result == 0) {
    std::istringstream outputStream(output);
    std::string line;
    bool found = false;
    while (cmSystemTools::GetLineFromStream(outputStream, line)) {
      if (cmHasLiteralPrefix(line, "Build file encoding: ")) {
        cm::string_view lineView(line);
        cm::string_view encoding =
          lineView.substr(cmStrLen("Build file encoding: "));
        if (encoding == "UTF-8") {
          // Ninja expects UTF-8. We use that internally. No conversion needed.
          this->NinjaExpectedEncoding = codecvt::None;
        } else {
          this->NinjaExpectedEncoding = codecvt::ANSI;
        }
        found = true;
        break;
      }
    }
    if (!found) {
      this->GetCMakeInstance()->IssueMessage(
        MessageType::WARNING,
        "Could not determine Ninja's code page, defaulting to UTF-8");
      this->NinjaExpectedEncoding = codecvt::None;
    }
  } else {
    this->NinjaExpectedEncoding = codecvt::ANSI;
  }
}